

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_load_from_package
              (plugin_manager manager,plugin p,loader_impl impl,char *path,void **handle_ptr)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  void *pvVar4;
  loader_impl impl_00;
  char *path_00;
  loader_handle_impl handle_impl_00;
  loader_impl plVar5;
  undefined8 *puVar6;
  undefined8 in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  loader_handle_impl iterator_handle_impl_1;
  size_t iterator_1;
  loader_handle_impl iterator_handle_impl;
  size_t iterator;
  loader_handle_impl handle_impl;
  loader_handle handle;
  size_t init_order;
  loader_path subpath;
  loader_impl_interface iface;
  loader_impl in_stack_ffffffffffffef78;
  char *in_stack_ffffffffffffef80;
  loader_impl plVar7;
  loader_handle in_stack_ffffffffffffef88;
  loader_impl_interface in_stack_ffffffffffffef90;
  loader_impl in_stack_ffffffffffffef98;
  loader_handle_impl in_stack_ffffffffffffefa0;
  void **in_stack_ffffffffffffefa8;
  char *in_stack_ffffffffffffefb0;
  plugin_manager in_stack_ffffffffffffefb8;
  plugin_manager in_stack_ffffffffffffefc8;
  loader_impl in_stack_ffffffffffffefe8;
  plugin in_stack_ffffffffffffeff0;
  plugin_manager in_stack_ffffffffffffeff8;
  
  if (((in_RDX != 0) && (lVar2 = plugin_iface(in_RSI), lVar2 != 0)) &&
     (sVar3 = loader_impl_handle_name
                        (in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,
                         (char *)in_stack_ffffffffffffefa8), 1 < sVar3)) {
    iVar1 = loader_impl_initialize
                      (in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8
                      );
    if (iVar1 != 0) {
      return 1;
    }
    pvVar4 = loader_impl_get_handle(in_stack_ffffffffffffef78,(char *)0x10827a);
    if (pvVar4 != (void *)0x0) {
      log_write_impl_va("metacall",0x462,"loader_impl_load_from_package",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,3,"Load from package handle failed, handle with name %s already loaded",
                        &stack0xffffffffffffefc8);
      return 1;
    }
    impl_00 = (loader_impl)vector_size(*(undefined8 *)(in_RDX + 0x20));
    vector_push_back_empty(*(undefined8 *)(in_RDX + 0x20));
    path_00 = (char *)(**(code **)(lVar2 + 0x20))(in_RDX,in_RCX);
    if (path_00 == (char *)0x0) {
      while( true ) {
        plVar7 = (loader_impl)((long)&impl_00->p + 1);
        impl_00 = plVar7;
        plVar5 = (loader_impl)vector_size(*(undefined8 *)(in_RDX + 0x20));
        if (plVar5 <= plVar7) break;
        vector_at(*(undefined8 *)(in_RDX + 0x20),impl_00);
        loader_impl_destroy_handle(in_stack_ffffffffffffefa0);
      }
      vector_pop_back(*(undefined8 *)(in_RDX + 0x20));
    }
    else {
      handle_impl_00 =
           loader_impl_load_handle
                     (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,
                      in_stack_ffffffffffffef80,(size_t)in_stack_ffffffffffffef78);
      if (handle_impl_00 != (loader_handle_impl)0x0) {
        handle_impl_00->populated = 1;
        iVar1 = set_insert(*(undefined8 *)(in_RDX + 0x10),handle_impl_00->path,handle_impl_00);
        if (iVar1 == 0) {
          iVar1 = set_insert(*(undefined8 *)(in_RDX + 0x18),handle_impl_00->module,handle_impl_00);
          if (iVar1 == 0) {
            iVar1 = (**(code **)(lVar2 + 0x30))(in_RDX,handle_impl_00->module,handle_impl_00->ctx);
            if ((iVar1 == 0) &&
               (iVar1 = loader_impl_handle_register
                                  (in_stack_ffffffffffffefc8,impl_00,path_00,handle_impl_00,
                                   in_stack_ffffffffffffefa8), iVar1 == 0)) {
              vector_set(*(undefined8 *)(in_RDX + 0x20),impl_00,&stack0xffffffffffffefb0);
              return 0;
            }
            set_remove(*(undefined8 *)(in_RDX + 0x18),handle_impl_00->module);
          }
          set_remove(*(undefined8 *)(in_RDX + 0x10),handle_impl_00->path);
        }
        while( true ) {
          plVar7 = (loader_impl)((long)&impl_00->p + 1);
          impl_00 = plVar7;
          plVar5 = (loader_impl)vector_size(*(undefined8 *)(in_RDX + 0x20));
          if (plVar5 <= plVar7) break;
          puVar6 = (undefined8 *)vector_at(*(undefined8 *)(in_RDX + 0x20),impl_00);
          in_stack_ffffffffffffefa0 = (loader_handle_impl)*puVar6;
          loader_impl_destroy_handle(in_stack_ffffffffffffefa0);
        }
        vector_pop_back(*(undefined8 *)(in_RDX + 0x20));
        log_write_impl_va("metacall",0x499,"loader_impl_load_from_package",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,3,"Error when loading handle: %s",&stack0xffffffffffffefc8);
        loader_impl_destroy_handle(in_stack_ffffffffffffefa0);
      }
    }
  }
  return 1;
}

Assistant:

int loader_impl_load_from_package(plugin_manager manager, plugin p, loader_impl impl, const loader_path path, void **handle_ptr)
{
	if (impl != NULL)
	{
		loader_impl_interface iface = loader_iface(p);
		loader_path subpath;
		size_t init_order;

		if (iface != NULL && loader_impl_handle_name(manager, path, subpath) > 1)
		{
			loader_handle handle;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_get_handle(impl, subpath) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from package handle failed, handle with name %s already loaded", subpath);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			handle = iface->load_from_package(impl, path);

			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader interface: %p - Loader handle: %p", (void *)iface, (void *)handle); */

			if (handle != NULL)
			{
				loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, handle, subpath, LOADER_PATH_SIZE);

				if (handle_impl != NULL)
				{
					handle_impl->populated = 1;

					if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
					{
						if (set_insert(impl->handle_impl_map, handle_impl->module, handle_impl) == 0)
						{
							if (iface->discover(impl, handle_impl->module, handle_impl->ctx) == 0)
							{
								if (loader_impl_handle_register(manager, impl, subpath, handle_impl, handle_ptr) == 0)
								{
									vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

									return 0;
								}
							}

							set_remove(impl->handle_impl_map, handle_impl->module);
						}

						set_remove(impl->handle_impl_path_map, handle_impl->path);
					}

					{
						size_t iterator;

						for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
						{
							loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

							loader_impl_destroy_handle(iterator_handle_impl);
						}

						vector_pop_back(impl->handle_impl_init_order);
					}

					log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", subpath);

					loader_impl_destroy_handle(handle_impl);
				}
			}
			else
			{
				size_t iterator;

				for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
				{
					loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

					loader_impl_destroy_handle(iterator_handle_impl);
				}

				vector_pop_back(impl->handle_impl_init_order);
			}
		}
	}

	return 1;
}